

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int string_buffer_widen(StringBuffer *s,int size)

{
  JSString *pJVar1;
  ulong uVar2;
  int iVar3;
  size_t slack;
  
  iVar3 = -1;
  if (s->error_status == 0) {
    pJVar1 = (JSString *)js_realloc2(s->ctx,s->str,(long)(size * 2) + 0x10,&slack);
    if (pJVar1 == (JSString *)0x0) {
      string_buffer_set_error(s);
    }
    else {
      for (uVar2 = (ulong)(uint)s->len; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
        *(ushort *)((long)&pJVar1->hash_next + uVar2 * 2 + 2) =
             (ushort)*(byte *)((long)&pJVar1->hash_next + uVar2 + 3);
      }
      s->is_wide_char = 1;
      s->size = (int)(slack >> 1) + size;
      s->str = pJVar1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static no_inline int string_buffer_widen(StringBuffer *s, int size)
{
    JSString *str;
    size_t slack;
    int i;

    if (s->error_status)
        return -1;

    str = js_realloc2(s->ctx, s->str, sizeof(JSString) + (size << 1), &slack);
    if (!str)
        return string_buffer_set_error(s);
    size += slack >> 1;
    for(i = s->len; i-- > 0;) {
        str->u.str16[i] = str->u.str8[i];
    }
    s->is_wide_char = 1;
    s->size = size;
    s->str = str;
    return 0;
}